

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O3

void __thiscall SqlGenerator::generateAggregateQueries(SqlGenerator *this)

{
  pointer pcVar1;
  Aggregate *pAVar2;
  char cVar3;
  bool bVar4;
  size_t sVar5;
  TDNode *pTVar6;
  long *plVar7;
  undefined8 *puVar8;
  Attribute *pAVar9;
  pointer ppAVar10;
  pointer pbVar11;
  Function *pFVar12;
  ulong *puVar13;
  undefined1 **ppuVar14;
  Query *pQVar15;
  size_type *psVar16;
  Aggregate *pAVar17;
  long *plVar18;
  ulong uVar19;
  char cVar20;
  undefined8 uVar21;
  size_t var;
  __node_base _Var22;
  char *__end;
  ulong uVar23;
  pair<std::__detail::_Node_iterator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  string sumString;
  string prodString;
  string prodString_1;
  string __str_3;
  string aggregateString;
  string joinString;
  string __str_7;
  string attributeString;
  unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fVarAggregateMap;
  ofstream ofs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  ulong *local_4c0;
  long local_4b8;
  ulong local_4b0;
  long lStack_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  string local_460;
  SqlGenerator *local_440;
  Query *local_438;
  ulong local_430;
  Query *local_428;
  ulong *local_420;
  long local_418;
  ulong local_410;
  long lStack_408;
  Aggregate *local_400;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8 [6];
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  ulong local_2f8;
  char *local_2f0;
  uint local_2e8;
  char local_2e0 [16];
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  _Hashtable<std::bitset<100UL>,_std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<100UL>_>,_std::hash<std::bitset<100UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_270;
  undefined1 local_238 [8];
  _WordT _Stack_230;
  undefined1 *local_228;
  _WordT _Stack_220;
  undefined1 local_218 [216];
  ios_base local_140 [272];
  
  local_318[0] = local_308;
  local_440 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"","");
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"","");
  uVar23 = 0;
  while (sVar5 = TreeDecomposition::numberOfRelations
                           ((local_440->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           ), uVar23 < sVar5) {
    pTVar6 = TreeDecomposition::getRelation
                       ((local_440->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar23);
    std::__cxx11::string::_M_append((char *)local_318,(ulong)(pTVar6->_name)._M_dataplus._M_p);
    sVar5 = TreeDecomposition::numberOfRelations
                      ((local_440->_td).
                       super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar23 = uVar23 + 1;
    if (uVar23 < sVar5) {
      std::__cxx11::string::append((char *)local_318);
    }
  }
  local_270._M_buckets = &local_270._M_single_bucket;
  local_270._M_bucket_count = 1;
  local_270._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_270._M_element_count = 0;
  local_270._M_rehash_policy._M_max_load_factor = 1.0;
  local_270._M_rehash_policy._M_next_resize = 0;
  local_270._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8 = 0;
  local_428 = (Query *)0x0;
  do {
    sVar5 = QueryCompiler::numberOfQueries
                      ((local_440->_qc).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar5 <= local_2f8) {
      local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3d8,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)local_3d8);
      std::ofstream::ofstream(local_238,(string *)local_3d8,_S_out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
        operator_delete(local_3d8[0]._M_dataplus._M_p);
      }
      if (local_270._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
        local_438 = (Query *)0x0;
      }
      else {
        local_438 = (Query *)0x0;
        _Var22._M_nxt = local_270._M_before_begin._M_nxt;
        do {
          local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
          uVar23 = 0;
          do {
            if (((ulong)_Var22._M_nxt[(uVar23 >> 6) + 1]._M_nxt >> (uVar23 & 0x3f) & 1) != 0) {
              pAVar9 = TreeDecomposition::getAttribute
                                 ((local_440->_td).
                                  super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,uVar23);
              local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
              pcVar1 = (pAVar9->_name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4a0,pcVar1,pcVar1 + (pAVar9->_name)._M_string_length);
              std::__cxx11::string::append((char *)&local_4a0);
              std::__cxx11::string::_M_append((char *)local_3d8,(ulong)local_4a0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                operator_delete(local_4a0._M_dataplus._M_p);
              }
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 != 100);
          std::__cxx11::string::pop_back();
          cVar20 = '\x01';
          if (9 < local_438) {
            pQVar15 = local_438;
            cVar3 = '\x04';
            do {
              cVar20 = cVar3;
              if (pQVar15 < 100) {
                cVar20 = cVar20 + -2;
                goto LAB_0029842c;
              }
              if (pQVar15 < 1000) {
                cVar20 = cVar20 + -1;
                goto LAB_0029842c;
              }
              if (pQVar15 < 10000) goto LAB_0029842c;
              bVar4 = 99999 < pQVar15;
              pQVar15 = (Query *)((ulong)pQVar15 / 10000);
              cVar3 = cVar20 + '\x04';
            } while (bVar4);
            cVar20 = cVar20 + '\x01';
          }
LAB_0029842c:
          local_420 = &local_410;
          std::__cxx11::string::_M_construct((ulong)&local_420,cVar20);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_420,(uint)local_418,(unsigned_long)local_438);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_420,0,(char *)0x0,0x2b1b3e);
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          psVar16 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_3f8.field_2._M_allocated_capacity = *psVar16;
            local_3f8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_3f8.field_2._M_allocated_capacity = *psVar16;
            local_3f8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_3f8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar16;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_3f8);
          local_4c0 = &local_4b0;
          puVar13 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar13) {
            local_4b0 = *puVar13;
            lStack_4a8 = plVar7[3];
          }
          else {
            local_4b0 = *puVar13;
            local_4c0 = (ulong *)*plVar7;
          }
          local_4b8 = plVar7[1];
          *plVar7 = (long)puVar13;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_4c0,(ulong)local_3d8[0]._M_dataplus._M_p);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          psVar16 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_460.field_2._M_allocated_capacity = *psVar16;
            local_460.field_2._8_8_ = puVar8[3];
          }
          else {
            local_460.field_2._M_allocated_capacity = *psVar16;
            local_460._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_460._M_string_length = puVar8[1];
          *puVar8 = psVar16;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_460,(ulong)_Var22._M_nxt[3]._M_nxt);
          local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
          puVar13 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_4e0.field_2._M_allocated_capacity = *puVar13;
            local_4e0.field_2._8_8_ = puVar8[3];
          }
          else {
            local_4e0.field_2._M_allocated_capacity = *puVar13;
            local_4e0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_4e0._M_string_length = puVar8[1];
          *puVar8 = puVar13;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          psVar16 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_480.field_2._M_allocated_capacity = *psVar16;
            local_480.field_2._8_8_ = puVar8[3];
          }
          else {
            local_480.field_2._M_allocated_capacity = *psVar16;
            local_480._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_480._M_string_length = puVar8[1];
          *puVar8 = psVar16;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_318[0]);
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          psVar16 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_4a0.field_2._M_allocated_capacity = *psVar16;
            local_4a0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_4a0.field_2._M_allocated_capacity = *psVar16;
            local_4a0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_4a0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar16;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_238,local_4a0._M_dataplus._M_p,local_4a0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            operator_delete(local_4e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._M_dataplus._M_p != &local_460.field_2) {
            operator_delete(local_460._M_dataplus._M_p);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p);
          }
          if (local_420 != &local_410) {
            operator_delete(local_420);
          }
          if (local_3d8[0]._M_string_length != 0) {
            std::__cxx11::string::pop_back();
            std::operator+(&local_4a0,"\nGROUP BY ",local_3d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238,local_4a0._M_dataplus._M_p,local_4a0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
              operator_delete(local_4a0._M_dataplus._M_p);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,");\n\n",4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
            operator_delete(local_3d8[0]._M_dataplus._M_p);
          }
          local_438 = (Query *)((long)local_438 + 1);
          _Var22._M_nxt = (_Var22._M_nxt)->_M_nxt;
        } while (_Var22._M_nxt != (_Hash_node_base *)0x0);
      }
      std::ofstream::close();
      local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3d8,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)local_3d8);
      std::ofstream::open((string *)local_238,(_Ios_Openmode)local_3d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
        operator_delete(local_3d8[0]._M_dataplus._M_p);
      }
      local_430 = 0;
      do {
        sVar5 = QueryCompiler::numberOfQueries
                          ((local_440->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (sVar5 <= local_430) {
          std::ofstream::close();
          local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3d8,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                     DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
          std::__cxx11::string::append((char *)local_3d8);
          std::ofstream::open((string *)local_238,(_Ios_Openmode)local_3d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
            operator_delete(local_3d8[0]._M_dataplus._M_p);
          }
          if (local_438 != (Query *)0x0) {
            uVar23 = 0;
            do {
              cVar20 = '\x01';
              if (9 < uVar23) {
                uVar19 = uVar23;
                cVar3 = '\x04';
                do {
                  cVar20 = cVar3;
                  if (uVar19 < 100) {
                    cVar20 = cVar20 + -2;
                    goto LAB_00299574;
                  }
                  if (uVar19 < 1000) {
                    cVar20 = cVar20 + -1;
                    goto LAB_00299574;
                  }
                  if (uVar19 < 10000) goto LAB_00299574;
                  bVar4 = 99999 < uVar19;
                  uVar19 = uVar19 / 10000;
                  cVar3 = cVar20 + '\x04';
                } while (bVar4);
                cVar20 = cVar20 + '\x01';
              }
LAB_00299574:
              local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_480,cVar20);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_480._M_dataplus._M_p,(uint)local_480._M_string_length,uVar23);
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,0x2b1b8c);
              local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
              psVar16 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_4a0.field_2._M_allocated_capacity = *psVar16;
                local_4a0.field_2._8_8_ = puVar8[3];
              }
              else {
                local_4a0.field_2._M_allocated_capacity = *psVar16;
                local_4a0._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_4a0._M_string_length = puVar8[1];
              *puVar8 = psVar16;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
              local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
              psVar16 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_3d8[0].field_2._0_8_ = *psVar16;
                local_3d8[0].field_2._8_8_ = puVar8[3];
              }
              else {
                local_3d8[0].field_2._0_8_ = *psVar16;
                local_3d8[0]._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_3d8[0]._M_string_length = puVar8[1];
              *puVar8 = psVar16;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_238,local_3d8[0]._M_dataplus._M_p,
                         local_3d8[0]._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
                operator_delete(local_3d8[0]._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                operator_delete(local_4a0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_480._M_dataplus._M_p != &local_480.field_2) {
                operator_delete(local_480._M_dataplus._M_p);
              }
              uVar23 = uVar23 + 1;
            } while ((Query *)uVar23 != local_438);
          }
          std::ofstream::close();
          local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3d8,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                     DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
          uVar23 = local_430;
          std::__cxx11::string::append((char *)local_3d8);
          std::ofstream::open((string *)local_238,(_Ios_Openmode)local_3d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
            operator_delete(local_3d8[0]._M_dataplus._M_p);
          }
          if (uVar23 != 0) {
            uVar23 = 0;
            do {
              cVar20 = '\x01';
              if (9 < uVar23) {
                uVar19 = uVar23;
                cVar3 = '\x04';
                do {
                  cVar20 = cVar3;
                  if (uVar19 < 100) {
                    cVar20 = cVar20 + -2;
                    goto LAB_002997bf;
                  }
                  if (uVar19 < 1000) {
                    cVar20 = cVar20 + -1;
                    goto LAB_002997bf;
                  }
                  if (uVar19 < 10000) goto LAB_002997bf;
                  bVar4 = 99999 < uVar19;
                  uVar19 = uVar19 / 10000;
                  cVar3 = cVar20 + '\x04';
                } while (bVar4);
                cVar20 = cVar20 + '\x01';
              }
LAB_002997bf:
              local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_480,cVar20);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_480._M_dataplus._M_p,(uint)local_480._M_string_length,uVar23);
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,0x2b1b8c);
              local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
              psVar16 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_4a0.field_2._M_allocated_capacity = *psVar16;
                local_4a0.field_2._8_8_ = puVar8[3];
              }
              else {
                local_4a0.field_2._M_allocated_capacity = *psVar16;
                local_4a0._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_4a0._M_string_length = puVar8[1];
              *puVar8 = psVar16;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
              local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
              psVar16 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_3d8[0].field_2._0_8_ = *psVar16;
                local_3d8[0].field_2._8_8_ = puVar8[3];
              }
              else {
                local_3d8[0].field_2._0_8_ = *psVar16;
                local_3d8[0]._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_3d8[0]._M_string_length = puVar8[1];
              *puVar8 = psVar16;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_238,local_3d8[0]._M_dataplus._M_p,
                         local_3d8[0]._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
                operator_delete(local_3d8[0]._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                operator_delete(local_4a0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_480._M_dataplus._M_p != &local_480.field_2) {
                operator_delete(local_480._M_dataplus._M_p);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != local_430);
          }
          std::ofstream::close();
          local_238 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_238 + *(long *)(_VTT - 0x18)) = _error_with_option_name;
          std::filebuf::~filebuf((filebuf *)&_Stack_230);
          std::ios_base::~ios_base(local_140);
          std::
          _Hashtable<std::bitset<100UL>,_std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<100UL>_>,_std::hash<std::bitset<100UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_270);
          if (local_290[0] != local_280) {
            operator_delete(local_290[0]);
          }
          if (local_318[0] != local_308) {
            operator_delete(local_318[0]);
          }
          return;
        }
        local_428 = QueryCompiler::getQuery
                              ((local_440->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               local_430);
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"");
        uVar23 = 0;
        do {
          if (((local_428->_fVars).super__Base_bitset<2UL>._M_w[uVar23 >> 6] >> (uVar23 & 0x3f) & 1)
              != 0) {
            pAVar9 = TreeDecomposition::getAttribute
                               ((local_440->_td).
                                super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,uVar23);
            local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
            pcVar1 = (pAVar9->_name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3d8,pcVar1,pcVar1 + (pAVar9->_name)._M_string_length);
            std::__cxx11::string::append((char *)local_3d8);
            std::__cxx11::string::_M_append((char *)&local_4a0,(ulong)local_3d8[0]._M_dataplus._M_p)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
              operator_delete(local_3d8[0]._M_dataplus._M_p);
            }
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != 100);
        local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"");
        ppAVar10 = (local_428->_aggregates).
                   super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((local_428->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppAVar10) {
          pAVar17 = (Aggregate *)0x0;
          do {
            pAVar2 = ppAVar10[(long)pAVar17];
            local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
            local_400 = pAVar17;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"");
            pbVar11 = (pAVar2->_agg).
                      super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((pAVar2->_agg).
                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish != pbVar11) {
              uVar23 = 0;
              do {
                memcpy(local_3d8,pbVar11 + uVar23,0xc0);
                local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
                sVar5 = 0;
                do {
                  bVar4 = std::bitset<1500UL>::test((bitset<1500UL> *)local_3d8,sVar5);
                  if ((bVar4) &&
                     (pFVar12 = QueryCompiler::getFunction
                                          ((local_440->_qc).
                                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr,sVar5), pFVar12->_operation != dynamic)) {
                    getFunctionString_abi_cxx11_(&local_3f8,local_440,sVar5);
                    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f8);
                    local_4c0 = &local_4b0;
                    puVar13 = puVar8 + 2;
                    if ((ulong *)*puVar8 == puVar13) {
                      local_4b0 = *puVar13;
                      lStack_4a8 = puVar8[3];
                    }
                    else {
                      local_4b0 = *puVar13;
                      local_4c0 = (ulong *)*puVar8;
                    }
                    local_4b8 = puVar8[1];
                    *puVar8 = puVar13;
                    puVar8[1] = 0;
                    *(undefined1 *)(puVar8 + 2) = 0;
                    std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_4c0);
                    if (local_4c0 != &local_4b0) {
                      operator_delete(local_4c0);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                      operator_delete(local_3f8._M_dataplus._M_p);
                    }
                  }
                  sVar5 = sVar5 + 1;
                } while (sVar5 != 0x5dc);
                if (local_460._M_string_length == 0) {
                  std::__cxx11::string::append((char *)&local_460);
                }
                else {
                  std::__cxx11::string::pop_back();
                }
                local_4c0 = &local_4b0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4c0,local_460._M_dataplus._M_p,
                           local_460._M_dataplus._M_p + local_460._M_string_length);
                std::__cxx11::string::append((char *)&local_4c0);
                std::__cxx11::string::_M_append((char *)&local_4e0,(ulong)local_4c0);
                if (local_4c0 != &local_4b0) {
                  operator_delete(local_4c0);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_460._M_dataplus._M_p != &local_460.field_2) {
                  operator_delete(local_460._M_dataplus._M_p);
                }
                uVar23 = uVar23 + 1;
                pbVar11 = (pAVar2->_agg).
                          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              } while (uVar23 < (ulong)(((long)(pAVar2->_agg).
                                               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pbVar11 >> 6) * -0x5555555555555555));
            }
            std::__cxx11::string::pop_back();
            std::operator+(&local_3f8,"SUM(",&local_4e0);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f8);
            local_4c0 = &local_4b0;
            puVar13 = puVar8 + 2;
            if ((ulong *)*puVar8 == puVar13) {
              local_4b0 = *puVar13;
              lStack_4a8 = puVar8[3];
            }
            else {
              local_4b0 = *puVar13;
              local_4c0 = (ulong *)*puVar8;
            }
            local_4b8 = puVar8[1];
            *puVar8 = puVar13;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            cVar20 = '\x01';
            if ((Aggregate *)0x9 < local_400) {
              pAVar17 = local_400;
              cVar3 = '\x04';
              do {
                cVar20 = cVar3;
                if (pAVar17 < (Aggregate *)0x64) {
                  cVar20 = cVar20 + -2;
                  goto LAB_00298d03;
                }
                if (pAVar17 < (Aggregate *)0x3e8) {
                  cVar20 = cVar20 + -1;
                  goto LAB_00298d03;
                }
                if (pAVar17 < (Aggregate *)0x2710) goto LAB_00298d03;
                bVar4 = (Aggregate *)0x1869f < pAVar17;
                pAVar17 = (Aggregate *)((ulong)pAVar17 / 10000);
                cVar3 = cVar20 + '\x04';
              } while (bVar4);
              cVar20 = cVar20 + '\x01';
            }
LAB_00298d03:
            local_420 = &local_410;
            std::__cxx11::string::_M_construct((ulong)&local_420,cVar20);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_420,(uint)local_418,(unsigned_long)local_400);
            uVar23 = 0xf;
            if (local_4c0 != &local_4b0) {
              uVar23 = local_4b0;
            }
            if (uVar23 < (ulong)(local_418 + local_4b8)) {
              uVar23 = 0xf;
              if (local_420 != &local_410) {
                uVar23 = local_410;
              }
              if (uVar23 < (ulong)(local_418 + local_4b8)) goto LAB_00298d86;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_420,0,(char *)0x0,(ulong)local_4c0);
            }
            else {
LAB_00298d86:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_4c0,(ulong)local_420);
            }
            local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
            psVar16 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_460.field_2._M_allocated_capacity = *psVar16;
              local_460.field_2._8_8_ = puVar8[3];
            }
            else {
              local_460.field_2._M_allocated_capacity = *psVar16;
              local_460._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_460._M_string_length = puVar8[1];
            *puVar8 = psVar16;
            puVar8[1] = 0;
            *(undefined1 *)psVar16 = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_460);
            local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
            psVar16 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_3d8[0].field_2._0_8_ = *psVar16;
              local_3d8[0].field_2._8_8_ = plVar7[3];
            }
            else {
              local_3d8[0].field_2._0_8_ = *psVar16;
              local_3d8[0]._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_3d8[0]._M_string_length = plVar7[1];
            *plVar7 = (long)psVar16;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_3d8[0]._M_dataplus._M_p)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
              operator_delete(local_3d8[0]._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_460._M_dataplus._M_p != &local_460.field_2) {
              operator_delete(local_460._M_dataplus._M_p);
            }
            if (local_420 != &local_410) {
              operator_delete(local_420);
            }
            if (local_4c0 != &local_4b0) {
              operator_delete(local_4c0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
              operator_delete(local_4e0._M_dataplus._M_p);
            }
            pAVar17 = (Aggregate *)
                      ((long)&(local_400->_agg).
                              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1);
            ppAVar10 = (local_428->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          } while (pAVar17 < (Aggregate *)
                             ((long)(local_428->_aggregates).
                                    super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar10 >> 3)
                  );
        }
        std::__cxx11::string::pop_back();
        local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
        if (local_4a0._M_string_length != 0) {
          std::operator+(&local_4e0,&local_4a0,&local_480);
          std::__cxx11::string::operator=((string *)&local_480,(string *)&local_4e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            operator_delete(local_4e0._M_dataplus._M_p);
          }
          std::__cxx11::string::pop_back();
          std::operator+(&local_4e0,"\nGROUP BY ",&local_4a0);
          std::__cxx11::string::_M_append((char *)local_3d8,(ulong)local_4e0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            operator_delete(local_4e0._M_dataplus._M_p);
          }
        }
        cVar20 = '\x01';
        if (9 < local_430) {
          uVar23 = local_430;
          cVar3 = '\x04';
          do {
            cVar20 = cVar3;
            if (uVar23 < 100) {
              cVar20 = cVar20 + -2;
              goto LAB_00299048;
            }
            if (uVar23 < 1000) {
              cVar20 = cVar20 + -1;
              goto LAB_00299048;
            }
            if (uVar23 < 10000) goto LAB_00299048;
            bVar4 = 99999 < uVar23;
            uVar23 = uVar23 / 10000;
            cVar3 = cVar20 + '\x04';
          } while (bVar4);
          cVar20 = cVar20 + '\x01';
        }
LAB_00299048:
        local_2f0 = local_2e0;
        std::__cxx11::string::_M_construct((ulong)&local_2f0,cVar20);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_2f0,local_2e8,local_430);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0x2b1b3e);
        local_2d0 = &local_2c0;
        plVar18 = plVar7 + 2;
        if ((long *)*plVar7 == plVar18) {
          local_2c0 = *plVar18;
          lStack_2b8 = plVar7[3];
        }
        else {
          local_2c0 = *plVar18;
          local_2d0 = (long *)*plVar7;
        }
        local_2c8 = plVar7[1];
        *plVar7 = (long)plVar18;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
        local_2b0 = &local_2a0;
        plVar18 = plVar7 + 2;
        if ((long *)*plVar7 == plVar18) {
          local_2a0 = *plVar18;
          lStack_298 = plVar7[3];
        }
        else {
          local_2a0 = *plVar18;
          local_2b0 = (long *)*plVar7;
        }
        local_2a8 = plVar7[1];
        *plVar7 = (long)plVar18;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2b0,(ulong)local_480._M_dataplus._M_p);
        puVar13 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar13) {
          local_410 = *puVar13;
          lStack_408 = plVar7[3];
          local_420 = &local_410;
        }
        else {
          local_410 = *puVar13;
          local_420 = (ulong *)*plVar7;
        }
        local_418 = plVar7[1];
        *plVar7 = (long)puVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_420);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        psVar16 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_3f8.field_2._M_allocated_capacity = *psVar16;
          local_3f8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_3f8.field_2._M_allocated_capacity = *psVar16;
          local_3f8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_3f8._M_string_length = puVar8[1];
        *puVar8 = psVar16;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_3f8,(ulong)local_318[0]);
        local_4c0 = &local_4b0;
        puVar13 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar13) {
          local_4b0 = *puVar13;
          lStack_4a8 = puVar8[3];
        }
        else {
          local_4b0 = *puVar13;
          local_4c0 = (ulong *)*puVar8;
        }
        local_4b8 = puVar8[1];
        *puVar8 = puVar13;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_4c0,(ulong)local_3d8[0]._M_dataplus._M_p);
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        psVar16 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_460.field_2._M_allocated_capacity = *psVar16;
          local_460.field_2._8_8_ = puVar8[3];
        }
        else {
          local_460.field_2._M_allocated_capacity = *psVar16;
          local_460._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_460._M_string_length = puVar8[1];
        *puVar8 = psVar16;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_460);
        local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
        puVar13 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_4e0.field_2._M_allocated_capacity = *puVar13;
          local_4e0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_4e0.field_2._M_allocated_capacity = *puVar13;
          local_4e0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_4e0._M_string_length = puVar8[1];
        *puVar8 = puVar13;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,local_4e0._M_dataplus._M_p,local_4e0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p);
        }
        if (local_420 != &local_410) {
          operator_delete(local_420);
        }
        if (local_2b0 != &local_2a0) {
          operator_delete(local_2b0);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0);
        }
        if (local_2f0 != local_2e0) {
          operator_delete(local_2f0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
          operator_delete(local_3d8[0]._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p);
        }
        local_430 = local_430 + 1;
      } while( true );
    }
    local_438 = QueryCompiler::getQuery
                          ((local_440->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           local_2f8);
    local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
    ppAVar10 = (local_438->_aggregates).
               super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((local_438->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppAVar10) {
      uVar23 = 0;
      do {
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        pAVar17 = ppAVar10[uVar23];
        local_430 = uVar23;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"");
        pbVar11 = (pAVar17->_agg).
                  super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_400 = pAVar17;
        if ((pAVar17->_agg).
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_finish != pbVar11) {
          uVar23 = 0;
          do {
            memcpy((bitset<1500UL> *)local_238,pbVar11 + uVar23,0xc0);
            local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"");
            sVar5 = 0;
            do {
              bVar4 = std::bitset<1500UL>::test((bitset<1500UL> *)local_238,sVar5);
              if (bVar4) {
                getFunctionString_abi_cxx11_(&local_460,local_440,sVar5);
                plVar7 = (long *)std::__cxx11::string::append((char *)&local_460);
                local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
                puVar13 = (ulong *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar13) {
                  local_4e0.field_2._M_allocated_capacity = *puVar13;
                  local_4e0.field_2._8_8_ = plVar7[3];
                }
                else {
                  local_4e0.field_2._M_allocated_capacity = *puVar13;
                  local_4e0._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_4e0._M_string_length = plVar7[1];
                *plVar7 = (long)puVar13;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                std::__cxx11::string::_M_append
                          ((char *)&local_480,(ulong)local_4e0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
                  operator_delete(local_4e0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_460._M_dataplus._M_p != &local_460.field_2) {
                  operator_delete(local_460._M_dataplus._M_p);
                }
              }
              sVar5 = sVar5 + 1;
            } while (sVar5 != 0x5dc);
            if (local_480._M_string_length == 0) {
              std::__cxx11::string::append((char *)&local_480);
            }
            else {
              std::__cxx11::string::pop_back();
            }
            local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4e0,local_480._M_dataplus._M_p,
                       local_480._M_dataplus._M_p + local_480._M_string_length);
            std::__cxx11::string::append((char *)&local_4e0);
            std::__cxx11::string::_M_append((char *)&local_4a0,(ulong)local_4e0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
              operator_delete(local_4e0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              operator_delete(local_480._M_dataplus._M_p);
            }
            uVar23 = uVar23 + 1;
            pbVar11 = (local_400->_agg).
                      super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar23 < (ulong)(((long)(local_400->_agg).
                                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pbVar11 >> 6) * -0x5555555555555555));
        }
        std::__cxx11::string::pop_back();
        std::operator+(&local_460,"SUM(",&local_4a0);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_460);
        local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
        puVar13 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_4e0.field_2._M_allocated_capacity = *puVar13;
          local_4e0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_4e0.field_2._M_allocated_capacity = *puVar13;
          local_4e0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_4e0._M_string_length = puVar8[1];
        *puVar8 = puVar13;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        cVar20 = '\x01';
        if ((Query *)0x9 < local_428) {
          pQVar15 = local_428;
          cVar3 = '\x04';
          do {
            cVar20 = cVar3;
            if (pQVar15 < (Query *)0x64) {
              cVar20 = cVar20 + -2;
              goto LAB_00297fb2;
            }
            if (pQVar15 < (Query *)0x3e8) {
              cVar20 = cVar20 + -1;
              goto LAB_00297fb2;
            }
            if (pQVar15 < (Query *)0x2710) goto LAB_00297fb2;
            bVar4 = (Query *)0x1869f < pQVar15;
            pQVar15 = (Query *)((ulong)pQVar15 / 10000);
            cVar3 = cVar20 + '\x04';
          } while (bVar4);
          cVar20 = cVar20 + '\x01';
        }
LAB_00297fb2:
        local_4c0 = &local_4b0;
        std::__cxx11::string::_M_construct((ulong)&local_4c0,cVar20);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_4c0,(uint)local_4b8,(unsigned_long)local_428);
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          uVar21 = local_4e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_4b8 + local_4e0._M_string_length) {
          uVar23 = 0xf;
          if (local_4c0 != &local_4b0) {
            uVar23 = local_4b0;
          }
          if (uVar23 < local_4b8 + local_4e0._M_string_length) goto LAB_0029802a;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_4c0,0,(char *)0x0,(ulong)local_4e0._M_dataplus._M_p);
        }
        else {
LAB_0029802a:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_4e0,(ulong)local_4c0);
        }
        local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
        psVar16 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_480.field_2._M_allocated_capacity = *psVar16;
          local_480.field_2._8_8_ = puVar8[3];
        }
        else {
          local_480.field_2._M_allocated_capacity = *psVar16;
          local_480._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_480._M_string_length = puVar8[1];
        *puVar8 = psVar16;
        puVar8[1] = 0;
        *(undefined1 *)psVar16 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_480);
        local_238 = (undefined1  [8])&local_228;
        ppuVar14 = (undefined1 **)(plVar7 + 2);
        if ((undefined1 **)*plVar7 == ppuVar14) {
          local_228 = *ppuVar14;
          _Stack_220 = plVar7[3];
        }
        else {
          local_228 = *ppuVar14;
          local_238 = (undefined1  [8])*plVar7;
        }
        _Stack_230 = plVar7[1];
        *plVar7 = (long)ppuVar14;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_3d8,(ulong)local_238);
        if (local_238 != (undefined1  [8])&local_228) {
          operator_delete((void *)local_238);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p);
        }
        local_428 = (Query *)((long)&local_428->_rootID + 1);
        uVar23 = local_430 + 1;
        ppAVar10 = (local_438->_aggregates).
                   super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (uVar23 < (ulong)((long)(local_438->_aggregates).
                                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar10 >>
                               3));
    }
    local_238 = (undefined1  [8])(local_438->_fVars).super__Base_bitset<2UL>._M_w[0];
    _Stack_230 = (local_438->_fVars).super__Base_bitset<2UL>._M_w[1];
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
    pVar24 = std::
             _Hashtable<std::bitset<100ul>,std::pair<std::bitset<100ul>const,std::__cxx11::string>,std::allocator<std::pair<std::bitset<100ul>const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::bitset<100ul>>,std::hash<std::bitset<100ul>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::_M_emplace<std::pair<std::bitset<100ul>const,std::__cxx11::string>>
                       ((_Hashtable<std::bitset<100ul>,std::pair<std::bitset<100ul>const,std::__cxx11::string>,std::allocator<std::pair<std::bitset<100ul>const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::bitset<100ul>>,std::hash<std::bitset<100ul>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)&local_270,(bitset<1500UL> *)local_238);
    if (local_228 != local_218) {
      operator_delete(local_228);
    }
    std::__cxx11::string::_M_append
              ((char *)((long)pVar24.first.
                              super__Node_iterator_base<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                              ._M_cur.
                              super__Node_iterator_base<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                       + 0x18),(ulong)local_3d8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
      operator_delete(local_3d8[0]._M_dataplus._M_p);
    }
    local_2f8 = local_2f8 + 1;
  } while( true );
}

Assistant:

void SqlGenerator::generateAggregateQueries()
{
    string joinString = "", attributeString  = "";
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {    
        joinString += _td->getRelation(rel)->_name;
        if (rel + 1 < _td->numberOfRelations())
            joinString += " NATURAL JOIN ";
    }
    
    // for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    //     attributeString += _td->getAttribute(var)->_name + ",";
    // attributeString.pop_back();
    
    //********** TODO: TODO: ********** 
    // technically we need to join in the parameters
    // for now we just fix the params
    //********** TODO: TODO: **********
    // TODO: TODO: TODO: THIS SHOULD REALLY BE LINEARREGRESSION GRADIENT
    // TODO: TODO: TODO: Commenting out for now
    // if (false && _model == LinearRegressionModel)
    // {
    //     // Add parameters to the join string !
    //     var_bitset features = _app->getFeatures();

    //     const var_bitset categoricalFeatures =
    //         static_pointer_cast<LinearRegression>(_app)->
    //         getCategoricalFeatures();
        
    //     std::string catParams = "", contParams = "";
    //     for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    //     {
    //         if (features[var])
    //         {
    //             Attribute* attr = _td->getAttribute(var);

    //             if (categoricalFeatures[var])
    //                 catParams += " NATURAL JOIN "+attr->_name+"_param";
    //             else
    //                 contParams += ","+attr->_name+"_param";
    //         }
    //     }
        
    //     joinString += catParams + contParams;
    // }

    unordered_map<var_bitset,string> fVarAggregateMap;

    size_t aggNum = 0;
    
    for (size_t queryID = 0; queryID < _qc->numberOfQueries(); ++queryID)
    {
        Query* query = _qc->getQuery(queryID);
        
        std::string aggregateString = "";
        for (size_t agg = 0; agg < query->_aggregates.size(); ++agg)
        {
            Aggregate* aggregate = query->_aggregates[agg];
            
            size_t aggIdx = 0;

            string sumString = "";
            for (size_t i = 0; i < aggregate->_agg.size(); i++)
            {
                const prod_bitset prod = aggregate->_agg[aggIdx];

                string prodString = "";
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
                {
                    if (prod.test(f))
                    {
                        prodString += getFunctionString(f)+"*";
                    }
                }

                if (!prodString.empty())
                    prodString.pop_back();
                else
                    prodString += "1";
                
                sumString += prodString+"+";
                ++aggIdx;
            }
            sumString.pop_back();
            aggregateString += "SUM("+sumString+") AS agg_"+to_string(aggNum++)+",";
        }

        auto it_pair = fVarAggregateMap.insert({query->_fVars,""});
        it_pair.first->second += aggregateString;        
    }

    ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/aggregates_merged.sql", std::ofstream::out);

    size_t aggID = 0;
    for (auto& fvarAggPair : fVarAggregateMap)
    {
        string fVarString = "";
        
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (fvarAggPair.first[var])
                fVarString += _td->getAttribute(var)->_name + ",";
        }

        fvarAggPair.second.pop_back();
        
        ofs << "CREATE TABLE agg_"+to_string(aggID++)+" AS (\n" 
            "SELECT "+fVarString+fvarAggPair.second+"\nFROM "+joinString;
        if (!fVarString.empty())
        {
            fVarString.pop_back();
            ofs << "\nGROUP BY "+fVarString;
        }
        ofs << ");\n\n";
    }

    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/aggregates.sql", std::ofstream::out);

    size_t aggID_unmerged = 0;
    for (size_t queryID = 0; queryID < _qc->numberOfQueries(); ++queryID)
    {
        Query* query = _qc->getQuery(queryID);

        string fVarString = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (query->_fVars[var])
                fVarString += _td->getAttribute(var)->_name + ",";
        }

        string aggregateString = "";
        for (size_t agg = 0; agg < query->_aggregates.size(); ++agg)
        {
            Aggregate* aggregate = query->_aggregates[agg];
            
            size_t aggIdx = 0;

            string sumString = "";
            for (size_t i = 0; i < aggregate->_agg.size(); i++)
            {
                const prod_bitset prod = aggregate->_agg[aggIdx];

                string prodString = "";
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
                {
                    if (prod.test(f) &&
                        _qc->getFunction(f)->_operation != Operation::dynamic)
                    {
                        prodString += getFunctionString(f)+"*";
                    }
                }

                if (!prodString.empty())
                    prodString.pop_back();
                else
                    prodString += "1";
                
                sumString += prodString+"+";
                ++aggIdx;
            }
            sumString.pop_back();

            aggregateString +="SUM("+sumString+") AS agg_"+to_string(agg)+",";
        }
        aggregateString.pop_back();
        
        std::string groupByString = "";
        if (!fVarString.empty())
        {
            aggregateString = fVarString+aggregateString;
            fVarString.pop_back();
            groupByString += "\nGROUP BY "+fVarString;
        }
        
        ofs << "CREATE TABLE agg_"+to_string(aggID_unmerged++)+" AS (\nSELECT "+
            aggregateString+"\nFROM "+joinString+groupByString+");\n\n";
    }

    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/aggregate_merged_cleanup.sql", std::ofstream::out);
    for (size_t i = 0; i < aggID; ++i)
        ofs << "DROP TABLE IF EXISTS agg_"+to_string(i)+";\n";
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/aggregate_cleanup.sql", std::ofstream::out);
    for (size_t i = 0; i < aggID_unmerged; ++i)
        ofs << "DROP TABLE IF EXISTS agg_"+to_string(i)+";\n";
    ofs.close();


}